

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitOnceTest_random_vector_Test<signed_char>::TestBody
          (SplitOnceTest_random_vector_Test<signed_char> *this)

{
  bool bVar1;
  reference rhs;
  char *pcVar2;
  value_type in_delim;
  AssertHelper local_100 [8];
  Message local_f8 [8];
  vector<signed_char,_std::allocator<signed_char>_> local_f0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0 [8];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  split_result;
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_> data;
  SplitOnceTest_random_vector_Test<signed_char> *this_local;
  
  in_delim = '\0';
  data.m_tokens.
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
  RandomTestData((RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                  *)&split_result.second.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,'\0',0,0);
  jessilib::
  split_once<std::vector<signed_char,std::allocator<signed_char>>,std::vector<signed_char,std::allocator<signed_char>>>
            ((pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
              *)local_98,(jessilib *)&data.m_fixed_word_length,
             (vector<signed_char,_std::allocator<signed_char>_> *)0x0,in_delim);
  rhs = std::
        vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
        ::operator[]((vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                      *)&data.m_str.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  testing::internal::EqHelper::
  Compare<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_b8,"split_result.first","data.m_tokens[0]",
             (vector<signed_char,_std::allocator<signed_char>_> *)local_98,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
  get_remainder(&local_f0,
                (RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                 *)&split_result.second.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,1);
  testing::internal::EqHelper::
  Compare<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_d8,"split_result.second","data.get_remainder(1)",
             (vector<signed_char,_std::allocator<signed_char>_> *)
             &split_result.first.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f0);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  std::
  pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  ::~pair((pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
           *)local_98);
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
  ~RandomTestData((RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                   *)&split_result.second.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random_vector) {
	using vector_type = std::vector<TypeParam>;
	RandomTestData<TypeParam, vector_type> data{};
	std::pair<vector_type, vector_type> split_result = split_once<vector_type>(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}